

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O2

bool __thiscall
duckdb::FlattenDependentJoins::MarkSubtreeCorrelated
          (FlattenDependentJoins *this,LogicalOperator *op)

{
  reference_map_t<LogicalOperator,_bool> *this_00;
  pointer puVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  byte bVar5;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer puVar6;
  key_type local_38;
  
  this_00 = &this->has_correlated_expressions;
  local_38._M_data = op;
  iVar3 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_38);
  bVar5 = *(byte *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_true>
                          ._M_cur + 0x10);
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (op->children).
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    bVar2 = MarkSubtreeCorrelated
                      (this,(puVar6->
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            )._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
    bVar5 = bVar5 | bVar2;
  }
  if (op->type == LOGICAL_GET) {
    if ((long)(op->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(op->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_00a64546;
  }
  else if (op->type == LOGICAL_CTE_REF) {
    local_38._M_data = op;
    pmVar4 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_38);
    *pmVar4 = true;
    bVar5 = 1;
    goto LAB_00a64546;
  }
  local_38._M_data = op;
  pmVar4 = ::std::__detail::
           _Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::LogicalOperator>,_bool>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::LogicalOperator>,_duckdb::ReferenceHashFunction<duckdb::LogicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_38);
  *pmVar4 = (mapped_type)(bVar5 & 1);
LAB_00a64546:
  return (bool)(bVar5 & 1);
}

Assistant:

bool FlattenDependentJoins::MarkSubtreeCorrelated(LogicalOperator &op) {
	// Do not mark base table scans as correlated
	auto entry = has_correlated_expressions.find(op);
	D_ASSERT(entry != has_correlated_expressions.end());
	bool has_correlation = entry->second;
	for (auto &child : op.children) {
		has_correlation |= MarkSubtreeCorrelated(*child.get());
	}
	if (op.type != LogicalOperatorType::LOGICAL_GET || op.children.size() == 1) {
		if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
			has_correlated_expressions[op] = true;
			return true;
		} else {
			has_correlated_expressions[op] = has_correlation;
		}
	}
	return has_correlation;
}